

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O0

SelectionSet * __thiscall OpenMD::SelectionEvaluator::evaluate(SelectionEvaluator *this,int frame)

{
  undefined4 in_EDX;
  long in_RSI;
  SelectionSet *in_RDI;
  SelectionEvaluator *unaff_retaddr;
  SelectionSet bs;
  undefined4 in_stack_ffffffffffffffe8;
  long lVar1;
  SelectionSet *bs_00;
  
  lVar1 = in_RSI;
  bs_00 = in_RDI;
  createSelectionSets((SelectionEvaluator *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  if ((*(byte *)(in_RSI + 0x531) & 1) != 0) {
    *(undefined4 *)(in_RSI + 0x1c0) = 0;
    instructionDispatchLoop(unaff_retaddr,bs_00,(int)((ulong)lVar1 >> 0x20));
  }
  SelectionSet::parallelReduce(bs_00);
  SelectionSet::~SelectionSet((SelectionSet *)0x305df5);
  return in_RDI;
}

Assistant:

SelectionSet SelectionEvaluator::evaluate(int frame) {
    SelectionSet bs = createSelectionSets();
    if (isLoaded_) {
      pc = 0;
      instructionDispatchLoop(bs, frame);
    }
    return bs.parallelReduce();
  }